

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O0

int make_pack(mixed_encoding encoding,int channels,mixed_pack *pack)

{
  int iVar1;
  uint local_38;
  uint local_34;
  uint32_t i;
  uint32_t size;
  char *buffer;
  mixed_pack *pmStack_20;
  int frames;
  mixed_pack *pack_local;
  mixed_encoding local_10;
  int channels_local;
  mixed_encoding encoding_local;
  
  buffer._4_4_ = 500;
  pack->encoding = encoding;
  pack->channels = (mixed_channel_t)channels;
  pack->samplerate = 48000;
  pmStack_20 = pack;
  pack_local._4_4_ = channels;
  local_10 = encoding;
  iVar1 = mixed_make_pack(500,pack);
  if (iVar1 == 0) {
    channels_local = 0;
  }
  else {
    local_34 = 0xffffffff;
    mixed_pack_request_write(&i,&local_34,pmStack_20);
    for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
      iVar1 = rand();
      *(char *)(_i + (ulong)local_38) = (char)((long)iVar1 % 0x80);
    }
    mixed_pack_finish_write(local_34,pmStack_20);
    channels_local = 1;
  }
  return channels_local;
}

Assistant:

static int make_pack(enum mixed_encoding encoding, int channels, struct mixed_pack *pack){
  int frames = 500;
  pack->encoding = encoding;
  pack->channels = channels;
  pack->samplerate = 48000;
  if(!mixed_make_pack(frames, pack))
    return 0;
  char *buffer;
  uint32_t size = UINT32_MAX;
  mixed_pack_request_write((void**)&buffer, &size, pack);
  for(uint32_t i=0; i<size; ++i)
    buffer[i] = rand()%128;
  mixed_pack_finish_write(size, pack);
  return 1;
}